

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O1

void __thiscall
Saturation::ConsequenceFinder::indexClause
          (ConsequenceFinder *this,uint indexNum,Clause *cl,bool add)

{
  ZIArray<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *this_00;
  ulong uVar1;
  SkipList<Kernel::Clause_*,_Lib::Int> *pSVar2;
  Node *pNVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  void **head;
  
  if ((int)CONCAT71(in_register_00000009,add) != 0) {
    this_00 = &this->_index;
    uVar1 = (ulong)indexNum;
    if ((this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._capacity <= uVar1)
    {
      ::Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::expandToFit
                (&this_00->super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,uVar1);
    }
    if ((this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._array[uVar1] ==
        (SkipList<Kernel::Clause_*,_Lib::Int> *)0x0) {
      pSVar2 = (SkipList<Kernel::Clause_*,_Lib::Int> *)
               ::Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
      ;
      pNVar3 = (Node *)::operator_new(0x110,0x10);
      pSVar2->_left = pNVar3;
      pSVar2->_top = 0;
      lVar4 = 0x100;
      do {
        *(undefined8 *)((long)pSVar2->_left->nodes + lVar4 + -8) = 0;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
      if ((this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._capacity <= uVar1
         ) {
        ::Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::expandToFit
                  (&this_00->super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,uVar1);
      }
      (this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._array[uVar1] = pSVar2
      ;
    }
    if ((this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._capacity <= uVar1)
    {
      ::Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::expandToFit
                (&this_00->super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,uVar1);
    }
    puVar5 = (undefined8 *)
             ::Lib::SkipList<Kernel::Clause*,Lib::Int>::insertPositionRaw<Kernel::Clause*>
                       ((SkipList<Kernel::Clause*,Lib::Int> *)
                        (this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>.
                        _array[uVar1],cl);
    *puVar5 = cl;
    return;
  }
  uVar1 = (ulong)indexNum;
  if ((this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._capacity <= uVar1) {
    ::Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::expandToFit
              (&(this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,uVar1);
  }
  ::Lib::SkipList<Kernel::Clause*,Lib::Int>::remove<Kernel::Clause*>
            ((SkipList<Kernel::Clause*,Lib::Int> *)
             (this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>._array[uVar1],
             cl);
  return;
}

Assistant:

void ConsequenceFinder::indexClause(unsigned indexNum, Clause* cl, bool add)
{
  if(add) {
    if(!_index[indexNum]) {
      _index[indexNum]=new ClauseSL();
    }
    _index[indexNum]->insert(cl);
  }
  else {
    ASS(_index[indexNum]);
    _index[indexNum]->remove(cl);
  }
}